

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  void *pvVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  
  uVar5 = (ulong)(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                 super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    pvVar1 = (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
             super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
             super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
             super_SmallVectorBase.BeginX;
    lVar4 = 0;
    do {
      free(*(void **)((long)pvVar1 + lVar4));
      lVar4 = lVar4 + 0x10;
    } while (uVar5 << 4 != lVar4);
  }
  (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.Size
       = 0;
  uVar5 = (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                 super_SmallVectorTemplateBase<void_*,_true>.
                 super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    this->BytesAllocated = 0;
    plVar6 = (long *)(this->Slabs).super_SmallVectorImpl<void_*>.
                     super_SmallVectorTemplateBase<void_*,_true>.
                     super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    pcVar2 = (char *)*plVar6;
    this->CurPtr = pcVar2;
    this->End = pcVar2 + 0x1000;
    uVar3 = 1;
    if (uVar5 != 1) {
      lVar4 = 8;
      do {
        free(*(void **)((long)plVar6 + lVar4));
        lVar4 = lVar4 + 8;
      } while (uVar5 << 3 != lVar4);
      plVar6 = (long *)(this->Slabs).super_SmallVectorImpl<void_*>.
                       super_SmallVectorTemplateBase<void_*,_true>.
                       super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
      uVar3 = (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                     super_SmallVectorTemplateBase<void_*,_true>.
                     super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
    }
    SmallVectorImpl<void_*>::erase
              (&(this->Slabs).super_SmallVectorImpl<void_*>,(const_iterator)(plVar6 + 1),
               (const_iterator)(plVar6 + uVar3));
    return;
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }